

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_FP3NotEquals_Test::TestBody(VectorsTest_FP3NotEquals_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  String *this_00;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FP3 v2;
  FP3 v1;
  undefined1 in_stack_ffffffffffffff0f;
  String *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar4;
  undefined8 in_stack_ffffffffffffff28;
  int line;
  Vector3<double> *this_01;
  Vector3<double> *this_02;
  Type type;
  AssertionResult *this_03;
  String local_b0;
  Message *in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  AssertionResult *in_stack_ffffffffffffff88;
  AssertionResult local_48;
  Vector3<double> local_38;
  Vector3<double> local_20;
  
  line = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  this_01 = &local_20;
  pica::Vector3<double>::Vector3(this_01,13.0,25.0,21.0);
  this_02 = &local_38;
  pica::Vector3<double>::Vector3(this_02,6.0,8.0,2.0);
  pica::operator!=(this_01,this_02);
  type = (Type)((ulong)this_02 >> 0x20);
  this_03 = &local_48;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_ffffffffffffff88,
               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_stack_ffffffffffffff78.ptr_,(char *)in_stack_ffffffffffffff70);
    pcVar3 = testing::internal::String::c_str((String *)&stack0xffffffffffffff88);
    line = (int)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,(char *)this_01,line,
               (char *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff10);
    testing::internal::String::~String(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x1e6421);
  }
  uVar5 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e64ac);
  if (uVar5 == 0) {
    bVar1 = pica::operator!=(&local_20,&local_20);
    uVar4 = true;
    if (!bVar1) {
      uVar4 = pica::operator!=(&local_38,&local_38);
    }
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
    uVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff70);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)this_03);
      testing::internal::GetBoolAssertionFailureMessage
                (in_stack_ffffffffffffff88,(char *)CONCAT44(uVar5,in_stack_ffffffffffffff80),
                 (char *)in_stack_ffffffffffffff78.ptr_,(char *)in_stack_ffffffffffffff70);
      this_00 = (String *)testing::internal::String::c_str(&local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_03,type,(char *)this_01,line,
                 (char *)CONCAT17(uVar4,CONCAT16(uVar2,in_stack_ffffffffffffff20)));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::String::~String(this_00);
      testing::Message::~Message((Message *)0x1e65e5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e6661);
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3NotEquals)
{
    FP3 v1(13, 25, 21), v2(6, 8, 2);
    ASSERT_TRUE(v1 != v2);
    ASSERT_FALSE((v1 != v1) || (v2 != v2));
}